

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

void __thiscall crnlib::crn_comp::optimize_alpha(crn_comp *this)

{
  bool bVar1;
  endpoint_indices_details *peVar2;
  uint16 i;
  ushort uVar3;
  uint uVar4;
  optimize_alpha_params *poVar5;
  uint uVar6;
  ulong uVar7;
  result *prVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined4 uVar13;
  float *pfVar14;
  undefined4 uVar15;
  uint size;
  uint i_1;
  long lVar16;
  void *pData_ptr;
  bool bVar17;
  vector<unsigned_int> sum;
  vector<unsigned_int> hist;
  vector<crnlib::optimize_alpha_params::unpacked_endpoint> unpacked_endpoints;
  result remapping_trial [4];
  
  uVar6 = (this->m_alpha_endpoints).m_size;
  uVar3 = (ushort)uVar6;
  vector<unsigned_int>::vector(&hist,(uVar6 & 0xffff) * (uVar6 & 0xffff));
  size = uVar6 & 0xffff;
  vector<unsigned_int>::vector(&sum,uVar6 & 0xffff);
  bVar17 = this->m_has_comp[1];
  bVar1 = this->m_has_comp[2];
  uVar9 = 0;
  uVar11 = 0;
  for (uVar7 = 0; uVar7 < (this->m_endpoint_indices).m_size; uVar7 = uVar7 + 1) {
    peVar2 = (this->m_endpoint_indices).m_p;
    uVar12 = (uint)peVar2[uVar7].field_0.field_0.alpha0;
    uVar10 = (uint)peVar2[uVar7].field_0.field_0.alpha1;
    if (peVar2[uVar7].reference == '\0') {
      if ((bVar17 != false) && (uVar11 != uVar12)) {
        hist.m_p[size * uVar12 + uVar11] = hist.m_p[size * uVar12 + uVar11] + 1;
        hist.m_p[uVar11 * size + uVar12] = hist.m_p[uVar11 * size + uVar12] + 1;
        sum.m_p[uVar12] = sum.m_p[uVar12] + 1;
        sum.m_p[uVar11] = sum.m_p[uVar11] + 1;
      }
      if ((bVar1 != false) && (uVar9 != uVar10)) {
        hist.m_p[(uVar6 & 0xffff) * uVar10 + uVar9] =
             hist.m_p[(uVar6 & 0xffff) * uVar10 + uVar9] + 1;
        hist.m_p[uVar9 * (uVar6 & 0xffff) + uVar10] =
             hist.m_p[uVar9 * (uVar6 & 0xffff) + uVar10] + 1;
        sum.m_p[uVar10] = sum.m_p[uVar10] + 1;
        sum.m_p[uVar9] = sum.m_p[uVar9] + 1;
      }
    }
    uVar9 = uVar10;
    uVar11 = uVar12;
  }
  uVar6 = 0;
  uVar15 = 0;
  for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
    uVar9 = sum.m_p[uVar7];
    bVar17 = uVar9 <= uVar6;
    if (!bVar17 || uVar6 == uVar9) {
      uVar6 = uVar9;
    }
    uVar13 = (int)uVar7;
    if (bVar17) {
      uVar13 = uVar15;
    }
    uVar15 = uVar13;
  }
  vector<crnlib::optimize_alpha_params::unpacked_endpoint>::vector(&unpacked_endpoints,size);
  for (lVar16 = 0; (ushort)lVar16 < uVar3; lVar16 = lVar16 + 1) {
    uVar4 = dxt5_block::unpack_endpoint((this->m_alpha_endpoints).m_p[lVar16],0);
    unpacked_endpoints.m_p[lVar16].low = (uint8)uVar4;
    uVar4 = dxt5_block::unpack_endpoint((this->m_alpha_endpoints).m_p[lVar16],1);
    unpacked_endpoints.m_p[lVar16].high = (uint8)uVar4;
  }
  prVar8 = remapping_trial;
  remapping_trial[0].packed_endpoints.m_p = (uchar *)0x0;
  remapping_trial[0].packed_endpoints.m_size = 0;
  remapping_trial[0].packed_endpoints.m_capacity = 0;
  remapping_trial[0].endpoint_remapping.m_p = (unsigned_short *)0x0;
  remapping_trial[0].endpoint_remapping.m_size = 0;
  remapping_trial[0].endpoint_remapping.m_capacity = 0;
  remapping_trial[1].endpoint_remapping.m_p = (unsigned_short *)0x0;
  remapping_trial[1].endpoint_remapping.m_size = 0;
  remapping_trial[1].endpoint_remapping.m_capacity = 0;
  remapping_trial[1].packed_endpoints.m_p = (uchar *)0x0;
  remapping_trial[1].packed_endpoints.m_size = 0;
  remapping_trial[1].packed_endpoints.m_capacity = 0;
  remapping_trial[2].endpoint_remapping.m_p = (unsigned_short *)0x0;
  remapping_trial[2].endpoint_remapping.m_size = 0;
  remapping_trial[2].endpoint_remapping.m_capacity = 0;
  remapping_trial[2].packed_endpoints.m_p = (uchar *)0x0;
  remapping_trial[2].packed_endpoints.m_size = 0;
  remapping_trial[2].packed_endpoints.m_capacity = 0;
  remapping_trial[3].endpoint_remapping.m_p = (unsigned_short *)0x0;
  remapping_trial[3].endpoint_remapping.m_size = 0;
  remapping_trial[3].endpoint_remapping.m_capacity = 0;
  remapping_trial[3].packed_endpoints.m_p = (uchar *)0x0;
  remapping_trial[3].packed_endpoints.m_size = 0;
  remapping_trial[3].packed_endpoints.m_capacity = 0;
  pfVar14 = (float *)&DAT_00195180;
  for (pData_ptr = (void *)0x0; pData_ptr != (void *)0x4; pData_ptr = (void *)((long)pData_ptr + 1))
  {
    poVar5 = crnlib_new<crnlib::optimize_alpha_params>();
    poVar5->unpacked_endpoints = unpacked_endpoints.m_p;
    poVar5->hist = hist.m_p;
    poVar5->n = uVar3;
    poVar5->selected = (uint16)uVar15;
    poVar5->weight = *pfVar14;
    poVar5->pResult = prVar8;
    task_pool::
    queue_object_task<crnlib::crn_comp,void(crnlib::crn_comp::*)(unsigned_long_long,void*)>
              (&this->m_task_pool,this,0x15ab46,0,pData_ptr);
    pfVar14 = pfVar14 + 1;
    prVar8 = prVar8 + 1;
  }
  task_pool::join(&this->m_task_pool);
  uVar6 = 0xffffffff;
  for (lVar16 = 0; lVar16 != 0xa0; lVar16 = lVar16 + 0x28) {
    if (*(uint *)((long)&remapping_trial[0].total_bits + lVar16) < uVar6) {
      vector<unsigned_char>::swap
                (&this->m_packed_alpha_endpoints,
                 (vector<unsigned_char> *)((long)&remapping_trial[0].packed_endpoints.m_p + lVar16))
      ;
      vector<unsigned_short>::swap
                (this->m_endpoint_remaping + 1,
                 (vector<unsigned_short> *)
                 ((long)&remapping_trial[0].endpoint_remapping.m_p + lVar16));
      uVar6 = *(uint *)((long)&remapping_trial[0].total_bits + lVar16);
    }
  }
  lVar16 = 0x78;
  do {
    optimize_alpha_params::result::~result
              ((result *)((long)&remapping_trial[0].endpoint_remapping.m_p + lVar16));
    lVar16 = lVar16 + -0x28;
  } while (lVar16 != -0x28);
  vector<crnlib::optimize_alpha_params::unpacked_endpoint>::~vector(&unpacked_endpoints);
  vector<unsigned_int>::~vector(&sum);
  vector<unsigned_int>::~vector(&hist);
  return;
}

Assistant:

void crn_comp::optimize_alpha() {
  uint16 n = m_alpha_endpoints.size();
  crnlib::vector<uint> hist(n * n);
  crnlib::vector<uint> sum(n);
  bool hasAlpha0 = m_has_comp[cAlpha0], hasAlpha1 = m_has_comp[cAlpha1];
  for (uint i0, i1, i0_prev = 0, i1_prev = 0, b = 0; b < m_endpoint_indices.size(); b++, i0_prev = i0, i1_prev = i1) {
    i0 = m_endpoint_indices[b].alpha0;
    i1 = m_endpoint_indices[b].alpha1;    
    if (!m_endpoint_indices[b].reference) {
      if (hasAlpha0 && i0 != i0_prev) {
        hist[i0 * n + i0_prev]++;
        hist[i0_prev * n + i0]++;
        sum[i0]++;
        sum[i0_prev]++;
      }
      if (hasAlpha1 && i1 != i1_prev) {
        hist[i1 * n + i1_prev]++;
        hist[i1_prev * n + i1]++;
        sum[i1]++;
        sum[i1_prev]++;
      }
    }
  }
  uint16 selected = 0;
  uint best_sum = 0;
  for (uint16 i = 0; i < n; i++) {
    if (best_sum < sum[i]) {
      best_sum = sum[i];
      selected = i;
    }
  }
  crnlib::vector<optimize_alpha_params::unpacked_endpoint> unpacked_endpoints(n);
  for (uint16 i = 0; i < n; i++) {
    unpacked_endpoints[i].low = dxt5_block::unpack_endpoint(m_alpha_endpoints[i], 0);
    unpacked_endpoints[i].high = dxt5_block::unpack_endpoint(m_alpha_endpoints[i], 1);
  }

  optimize_alpha_params::result remapping_trial[4];
  float weights[4] = {0, 0, 1.0f / 6.0f, 0.5f};
  for (uint i = 0; i < 4; i++) {
    optimize_alpha_params* pParams = crnlib_new<optimize_alpha_params>();
    pParams->unpacked_endpoints = unpacked_endpoints.get_ptr();
    pParams->hist = hist.get_ptr();
    pParams->n = n;
    pParams->selected = selected;
    pParams->weight = weights[i];
    pParams->pResult = remapping_trial + i;
    m_task_pool.queue_object_task(this, &crn_comp::optimize_alpha_endpoints_task, i, pParams);
  }
  m_task_pool.join();

  for (uint best_bits = cUINT32_MAX, i = 0; i < 4; i++) {
    if (remapping_trial[i].total_bits < best_bits) {
      m_packed_alpha_endpoints.swap(remapping_trial[i].packed_endpoints);
      m_endpoint_remaping[cAlpha0].swap(remapping_trial[i].endpoint_remapping);
      best_bits = remapping_trial[i].total_bits;
    }
  }
}